

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

bool __thiscall cfd::Psbt::IsFindTxIn(Psbt *this,OutPoint *outpoint,uint32_t *index)

{
  uint32_t uVar1;
  uint32_t *in_RDX;
  OutPoint *in_RSI;
  long in_RDI;
  string errmsg;
  CfdException *except;
  uint32_t temp_index;
  Txid local_48;
  uint32_t *local_20;
  OutPoint *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  core::OutPoint::GetTxid(&local_48,in_RSI);
  uVar1 = core::OutPoint::GetVout(local_18);
  uVar1 = core::Transaction::GetTxInIndex((Transaction *)(in_RDI + 0x10),&local_48,uVar1);
  core::Txid::~Txid((Txid *)0x51d87a);
  if (local_20 != (uint32_t *)0x0) {
    *local_20 = uVar1;
  }
  return true;
}

Assistant:

bool Psbt::IsFindTxIn(const OutPoint& outpoint, uint32_t* index) const {
  static constexpr const char* const kErrorMessage = "Txid is not found.";
  try {
    uint32_t temp_index =
        base_tx_.GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
    if (index != nullptr) *index = temp_index;
    return true;
  } catch (const CfdException& except) {
    std::string errmsg(except.what());
    if (errmsg == kErrorMessage) {
      return false;
    } else {
      throw except;
    }
  }
}